

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_parameter_expression.cpp
# Opt level: O2

void __thiscall
duckdb::BoundParameterExpression::BoundParameterExpression
          (BoundParameterExpression *this,string *identifier)

{
  LogicalType local_30;
  
  LogicalType::LogicalType(&local_30,UNKNOWN);
  Expression::Expression(&this->super_Expression,VALUE_PARAMETER,BOUND_PARAMETER,&local_30);
  LogicalType::~LogicalType(&local_30);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)&PTR__BoundParameterExpression_027a35e0;
  ::std::__cxx11::string::string((string *)&this->identifier,(string *)identifier);
  (this->parameter_data).internal.
  super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->parameter_data).internal.
  super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

BoundParameterExpression::BoundParameterExpression(const string &identifier)
    : Expression(ExpressionType::VALUE_PARAMETER, ExpressionClass::BOUND_PARAMETER,
                 LogicalType(LogicalTypeId::UNKNOWN)),
      identifier(identifier) {
}